

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

ssize_t __thiscall Arcflow::read(Arcflow *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  pointer *ppAVar2;
  iterator __position;
  int iVar3;
  int iVar4;
  clock_t cVar5;
  ssize_t sVar6;
  runtime_error *this_00;
  long lVar7;
  undefined4 in_register_00000034;
  FILE *fin;
  long lVar8;
  int nbtypes;
  int label;
  int i_v;
  int i_u;
  char _error_msg_ [256];
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  vector<Arc,_std::allocator<Arc>_> *local_140;
  Instance local_138;
  
  fin = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (this->ready == false) {
    cVar5 = clock();
    this->tstart = cVar5;
    Instance::Instance(&local_138,fin,MVP);
    Instance::operator=(&this->inst,&local_138);
    if (local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.nopts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.ctypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<Item,_std::allocator<Item>_>::~vector(&local_138.items);
    if (local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.Qs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_138.Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_138.Ws);
    iVar3 = __isoc99_fscanf(fin," #GRAPH_BEGIN#");
    if (iVar3 == 0) {
      iVar3 = __isoc99_fscanf(fin," $NBTYPES { %d } ;",&local_150);
      if (iVar3 == 1) {
        if (local_150 == (this->inst).nbtypes) {
          iVar3 = __isoc99_fscanf(fin," $S { %d } ;",&this->S);
          if (iVar3 == 1) {
            std::vector<int,_std::allocator<int>_>::resize(&this->Ts,(long)local_150);
            iVar3 = __isoc99_fscanf(fin," $Ts { ");
            if (iVar3 == 0) {
              if (0 < local_150) {
                lVar7 = 0;
                lVar8 = 0;
                do {
                  if (lVar8 != 0) {
                    iVar3 = __isoc99_fscanf(fin," ,");
                    if (iVar3 != 0) {
                      snprintf((char *)&local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" ,\") == 0",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                               ,0x24a);
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_00,(char *)&local_138);
                      goto LAB_0010cd1b;
                    }
                  }
                  iVar3 = __isoc99_fscanf(fin,"%d",(long)(this->Ts).
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar7);
                  if (iVar3 != 1) {
                    snprintf((char *)&local_138,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \"%d\", &Ts[i]) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x24b);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,(char *)&local_138);
                    goto LAB_0010cd1b;
                  }
                  lVar8 = lVar8 + 1;
                  lVar7 = lVar7 + 4;
                } while (lVar8 < local_150);
              }
              iVar3 = __isoc99_fscanf(fin," } ;");
              if (iVar3 == 0) {
                iVar3 = __isoc99_fscanf(fin," $LOSS { %d } ;",&this->LOSS);
                if (iVar3 == 1) {
                  iVar3 = __isoc99_fscanf(fin," $NV { %d } ;",&this->NV);
                  if (iVar3 == 1) {
                    piVar1 = &this->NA;
                    iVar3 = __isoc99_fscanf(fin," $NA { %d } ;",piVar1);
                    if (iVar3 == 1) {
                      iVar3 = __isoc99_fscanf(fin," $ARCS {");
                      if (iVar3 == 0) {
                        if (0 < *piVar1) {
                          local_140 = &this->A;
                          iVar3 = 0;
                          do {
                            iVar4 = __isoc99_fscanf(fin," %d %d %d ",&local_144,&local_148,
                                                    &local_14c);
                            if (iVar4 != 3) {
                              snprintf((char *)&local_138,0x100,
                                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                       "fscanf(fin, \" %d %d %d \", &i_u, &i_v, &label) == 3",
                                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                                       ,600);
                              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error(this_00,(char *)&local_138);
                              goto LAB_0010cd1b;
                            }
                            local_138.ndims = local_144;
                            local_138.nbtypes = local_148;
                            local_138.nsizes = local_14c;
                            __position._M_current =
                                 (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                                 super__Vector_impl_data._M_finish;
                            if (__position._M_current ==
                                (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage) {
                              std::vector<Arc,_std::allocator<Arc>_>::_M_realloc_insert<Arc>
                                        (local_140,__position,(Arc *)&local_138);
                            }
                            else {
                              (__position._M_current)->label = local_14c;
                              (__position._M_current)->u = local_144;
                              (__position._M_current)->v = local_148;
                              ppAVar2 = &(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>.
                                         _M_impl.super__Vector_impl_data._M_finish;
                              *ppAVar2 = *ppAVar2 + 1;
                            }
                            iVar3 = iVar3 + 1;
                          } while (iVar3 < *piVar1);
                        }
                        iVar3 = __isoc99_fscanf(fin," } ;");
                        if (iVar3 == 0) {
                          sVar6 = __isoc99_fscanf(fin," #GRAPH_END#");
                          if ((int)sVar6 == 0) {
                            this->ready = true;
                            return sVar6;
                          }
                          snprintf((char *)&local_138,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" #GRAPH_END#\") == 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                                   ,0x25c);
                          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_00,(char *)&local_138);
                        }
                        else {
                          snprintf((char *)&local_138,0x100,
                                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                   "fscanf(fin, \" } ;\") == 0",
                                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                                   ,0x25b);
                          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_00,(char *)&local_138);
                        }
                      }
                      else {
                        snprintf((char *)&local_138,0x100,
                                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                                 "fscanf(fin, \" $ARCS {\") == 0",
                                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                                 ,0x255);
                        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error(this_00,(char *)&local_138);
                      }
                    }
                    else {
                      snprintf((char *)&local_138,0x100,
                               "AssertionError: assertion `%s` failed in \"%s\" line %d",
                               "fscanf(fin, \" $NA { %d } ;\", &NA) == 1",
                               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                               ,0x253);
                      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(this_00,(char *)&local_138);
                    }
                  }
                  else {
                    snprintf((char *)&local_138,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "fscanf(fin, \" $NV { %d } ;\", &NV) == 1",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                             ,0x251);
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(this_00,(char *)&local_138);
                  }
                }
                else {
                  snprintf((char *)&local_138,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \" $LOSS { %d } ;\", &LOSS) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                           ,0x24f);
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_00,(char *)&local_138);
                }
              }
              else {
                snprintf((char *)&local_138,0x100,
                         "AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "fscanf(fin, \" } ;\") == 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                         ,0x24d);
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,(char *)&local_138);
              }
            }
            else {
              snprintf((char *)&local_138,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" $Ts { \") == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                       ,0x248);
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,(char *)&local_138);
            }
          }
          else {
            snprintf((char *)&local_138,0x100,
                     "AssertionError: assertion `%s` failed in \"%s\" line %d",
                     "fscanf(fin, \" $S { %d } ;\", &S) == 1",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                     ,0x245);
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,(char *)&local_138);
          }
        }
        else {
          snprintf((char *)&local_138,0x100,
                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "nbtypes == inst.nbtypes",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                   ,0x243);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,(char *)&local_138);
        }
      }
      else {
        snprintf((char *)&local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \" $NBTYPES { %d } ;\", &nbtypes) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x242);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,(char *)&local_138);
      }
    }
    else {
      snprintf((char *)&local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \" #GRAPH_BEGIN#\") == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
               ,0x23f);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(char *)&local_138);
    }
  }
  else {
    snprintf((char *)&local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x23c);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(char *)&local_138);
  }
LAB_0010cd1b:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::read(FILE *fin) {
	throw_assert(ready == false);
	tstart = CURTIME;
	inst = Instance(fin);
	throw_assert(fscanf(fin, " #GRAPH_BEGIN#") == 0);

	int nbtypes;
	throw_assert(fscanf(fin, " $NBTYPES { %d } ;", &nbtypes) == 1);
	throw_assert(nbtypes == inst.nbtypes);

	throw_assert(fscanf(fin, " $S { %d } ;", &S) == 1);

	Ts.resize(nbtypes);
	throw_assert(fscanf(fin, " $Ts { ") == 0);
	for (int i = 0; i < nbtypes; i++) {
		if (i) throw_assert(fscanf(fin, " ,") == 0);
		throw_assert(fscanf(fin, "%d", &Ts[i]) == 1);
	}
	throw_assert(fscanf(fin, " } ;") == 0);

	throw_assert(fscanf(fin, " $LOSS { %d } ;", &LOSS) == 1);

	throw_assert(fscanf(fin, " $NV { %d } ;", &NV) == 1);

	throw_assert(fscanf(fin, " $NA { %d } ;", &NA) == 1);

	throw_assert(fscanf(fin, " $ARCS {") == 0);
	for (int i = 0; i < NA; i++) {
		int i_u, i_v, label;
		throw_assert(fscanf(fin, " %d %d %d ", &i_u, &i_v, &label) == 3);
		A.push_back(Arc(i_u, i_v, label));
	}
	throw_assert(fscanf(fin, " } ;") == 0);
	throw_assert(fscanf(fin, " #GRAPH_END#") == 0);
	ready = true;
}